

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

void env_tilde_dsp(t_sigenv *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  t_sample *ptVar3;
  t_signal *ptVar4;
  int iVar5;
  
  ptVar4 = *sp;
  iVar5 = ptVar4->s_n;
  iVar1 = x->x_period;
  iVar2 = (iVar5 + iVar1) - iVar1 % iVar5;
  if (iVar1 % iVar5 == 0) {
    iVar2 = iVar1;
  }
  x->x_realperiod = iVar2;
  if (x->x_allocforvs < iVar5) {
    ptVar3 = (t_sample *)
             resizebytes(x->x_buf,(long)(x->x_allocforvs + x->x_npoints) << 2,
                         (long)(iVar5 + x->x_npoints) << 2);
    if (ptVar3 == (t_sample *)0x0) {
      pd_error((void *)0x0,"env~: out of memory");
      return;
    }
    x->x_buf = ptVar3;
    ptVar4 = *sp;
    iVar5 = ptVar4->s_n;
    x->x_allocforvs = iVar5;
  }
  dsp_add(env_tilde_perform,3,x,ptVar4->s_vec,(long)iVar5);
  return;
}

Assistant:

static void env_tilde_dsp(t_sigenv *x, t_signal **sp)
{
    if (x->x_period % sp[0]->s_n) x->x_realperiod =
        x->x_period + sp[0]->s_n - (x->x_period % sp[0]->s_n);
    else x->x_realperiod = x->x_period;
    if (sp[0]->s_n > x->x_allocforvs)
    {
        void *xx = resizebytes(x->x_buf,
            (x->x_npoints + x->x_allocforvs) * sizeof(t_sample),
            (x->x_npoints + sp[0]->s_n) * sizeof(t_sample));
        if (!xx)
        {
            pd_error(0, "env~: out of memory");
            return;
        }
        x->x_buf = (t_sample *)xx;
        x->x_allocforvs = sp[0]->s_n;
    }
    dsp_add(env_tilde_perform, 3, x, sp[0]->s_vec, (t_int)sp[0]->s_n);
}